

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4plus.hpp
# Opt level: O0

void __thiscall
trng::lagfib4plus<unsigned_long,_168U,_205U,_242U,_521U>::seed<trng::minstd>
          (lagfib4plus<unsigned_long,_168U,_205U,_242U,_521U> *this,minstd *g)

{
  result_type rVar1;
  result_type rVar2;
  result_type rVar3;
  minstd *in_RDI;
  int j;
  result_type r;
  uint i;
  int local_24;
  long local_20;
  uint local_14;
  
  for (local_14 = 0; local_14 < 0x209; local_14 = local_14 + 1) {
    local_20 = 0;
    for (local_24 = 0; local_24 < 0x40; local_24 = local_24 + 1) {
      local_20 = local_20 * 2;
      rVar1 = minstd::operator()(in_RDI);
      rVar2 = minstd::min();
      rVar3 = minstd::max();
      if (rVar3 >> 1 < rVar1 - rVar2) {
        local_20 = local_20 + 1;
      }
    }
    *(long *)(in_RDI + (ulong)local_14 * 2) = local_20;
  }
  in_RDI[0x800].S.r = 0x208;
  return;
}

Assistant:

void seed(gen &g) {
      for (unsigned int i{0}; i < D; ++i) {
        result_type r{0};
        for (int j{0}; j < std::numeric_limits<result_type>::digits; ++j) {
          r <<= 1;
          if (g() - gen::min() > gen::max() / 2)
            ++r;
        }
        S.r[i] = r;
      }
      S.index = D - 1;
    }